

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O0

int testArgumentParser(int param_1,char **param_2)

{
  bool bVar1;
  char **param_1_local;
  int param_0_local;
  
  bVar1 = anon_unknown.dwarf_14035::testArgumentParserDynamic();
  if (bVar1) {
    bVar1 = anon_unknown.dwarf_14035::testArgumentParserStatic();
    if (bVar1) {
      bVar1 = anon_unknown.dwarf_14035::testArgumentParserStaticBool();
      if (bVar1) {
        param_1_local._4_4_ = 0;
      }
      else {
        std::operator<<((ostream *)&std::cout,"While executing testArgumentParserStaticBool().\n");
        param_1_local._4_4_ = -1;
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"While executing testArgumentParserStatic().\n");
      param_1_local._4_4_ = -1;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"While executing testArgumentParserDynamic().\n");
    param_1_local._4_4_ = -1;
  }
  return param_1_local._4_4_;
}

Assistant:

int testArgumentParser(int /*unused*/, char* /*unused*/ [])
{
  if (!testArgumentParserDynamic()) {
    std::cout << "While executing testArgumentParserDynamic().\n";
    return -1;
  }

  if (!testArgumentParserStatic()) {
    std::cout << "While executing testArgumentParserStatic().\n";
    return -1;
  }

  if (!testArgumentParserStaticBool()) {
    std::cout << "While executing testArgumentParserStaticBool().\n";
    return -1;
  }

  return 0;
}